

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O3

REF_STATUS ref_export_bamg_msh(REF_GRID ref_grid,char *filename)

{
  size_t __size;
  REF_NODE pRVar1;
  REF_GLOB *pRVar2;
  REF_CELL pRVar3;
  REF_STATUS RVar4;
  FILE *__s;
  void *__s_00;
  long lVar5;
  undefined8 uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  char *pcVar10;
  int iVar11;
  REF_INT cell;
  ulong uVar12;
  REF_INT nodes [27];
  void *local_b8;
  int local_a8;
  int local_a4;
  uint local_a0;
  uint local_9c;
  
  if (ref_grid->twod == 0) {
    pcVar10 = "expected twod convention grid";
    uVar6 = 0x836;
LAB_00118ef1:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",uVar6,
           "ref_export_bamg_msh",pcVar10);
    return 1;
  }
  pRVar1 = ref_grid->node;
  __s = fopen(filename,"w");
  if (__s == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    pcVar10 = "unable to open file";
    uVar6 = 0x83a;
  }
  else {
    fwrite("MeshVersionFormatted 0\n\n",0x18,1,__s);
    fwrite("Dimension 2\n\n",0xd,1,__s);
    iVar11 = pRVar1->max;
    lVar8 = (long)iVar11;
    if (lVar8 < 0) {
      pcVar10 = "malloc o2n of REF_INT negative";
      uVar6 = 0x83f;
      goto LAB_00118ef1;
    }
    __size = lVar8 * 4;
    __s_00 = malloc(__size);
    if (__s_00 == (void *)0x0) {
      pcVar10 = "malloc o2n of REF_INT NULL";
      uVar6 = 0x83f;
    }
    else {
      if (iVar11 == 0) {
        local_b8 = malloc(__size);
        if (local_b8 != (void *)0x0) {
          fprintf(__s,"\nVertices\n%d\n",0);
          goto LAB_00118f51;
        }
      }
      else {
        memset(__s_00,0xff,__size);
        local_b8 = malloc(__size);
        if (local_b8 != (void *)0x0) {
          memset(local_b8,0xff,__size);
          pRVar2 = pRVar1->global;
          lVar5 = 0;
          uVar12 = 0;
          do {
            if (-1 < pRVar2[lVar5]) {
              iVar11 = (int)uVar12;
              *(int *)((long)__s_00 + lVar5 * 4) = iVar11;
              *(int *)((long)local_b8 + (long)iVar11 * 4) = (int)lVar5;
              uVar12 = (ulong)(iVar11 + 1);
            }
            lVar5 = lVar5 + 1;
          } while (lVar8 != lVar5);
          fprintf(__s,"\nVertices\n%d\n",uVar12);
          if (0 < (int)uVar12) {
            uVar9 = 0;
            do {
              lVar8 = (long)*(int *)((long)local_b8 + uVar9 * 4);
              fprintf(__s,"%.16E %.16E %d\n",pRVar1->real[lVar8 * 0xf],pRVar1->real[lVar8 * 0xf + 2]
                      ,1);
              uVar9 = uVar9 + 1;
            } while (uVar12 != uVar9);
          }
LAB_00118f51:
          pRVar3 = ref_grid->cell[0];
          iVar11 = 0;
          fprintf(__s,"\nEdges\n%d\n",(ulong)(uint)pRVar3->n);
          if (0 < pRVar3->max) {
            iVar11 = 0;
            cell = 0;
            do {
              RVar4 = ref_cell_nodes(pRVar3,cell,&local_a8);
              if (RVar4 == 0) {
                iVar11 = iVar11 + 1;
                fprintf(__s,"%d %d %d\n",(ulong)(*(int *)((long)__s_00 + (long)local_a8 * 4) + 1),
                        (ulong)(*(int *)((long)__s_00 + (long)local_a4 * 4) + 1),(ulong)local_a0);
              }
              cell = cell + 1;
            } while (cell < pRVar3->max);
          }
          iVar7 = pRVar3->n;
          if (iVar11 == iVar7) {
            pRVar3 = ref_grid->cell[3];
            iVar11 = 0;
            fprintf(__s,"\nTriangles\n%d\n",(ulong)(uint)pRVar3->n);
            if (0 < pRVar3->max) {
              iVar11 = 0;
              iVar7 = 0;
              do {
                RVar4 = ref_cell_nodes(pRVar3,iVar7,&local_a8);
                if (RVar4 == 0) {
                  iVar11 = iVar11 + 1;
                  fprintf(__s,"%d %d %d %d\n",
                          (ulong)(*(int *)((long)__s_00 + (long)local_a8 * 4) + 1),
                          (ulong)(*(int *)((long)__s_00 + (long)(int)local_a0 * 4) + 1),
                          (ulong)(*(int *)((long)__s_00 + (long)local_a4 * 4) + 1),(ulong)local_9c);
                }
                iVar7 = iVar7 + 1;
              } while (iVar7 < pRVar3->max);
            }
            iVar7 = pRVar3->n;
            if (iVar11 == iVar7) {
              free(local_b8);
              free(__s_00);
              fclose(__s);
              return 0;
            }
            pcVar10 = "triangle miscount";
            uVar6 = 0x860;
          }
          else {
            pcVar10 = "edge/quad miscount";
            uVar6 = 0x856;
          }
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
                 uVar6,"ref_export_bamg_msh",pcVar10,(long)iVar11,(long)iVar7);
          return 1;
        }
      }
      pcVar10 = "malloc n2o of REF_INT NULL";
      uVar6 = 0x840;
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",uVar6,
         "ref_export_bamg_msh",pcVar10);
  return 2;
}

Assistant:

REF_FCN static REF_STATUS ref_export_bamg_msh(REF_GRID ref_grid,
                                              const char *filename) {
  FILE *f;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT node;
  REF_INT *o2n, *n2o;
  REF_INT nnode;
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT nedge;
  REF_INT ntri;

  RAS(ref_grid_twod(ref_grid), "expected twod convention grid");

  f = fopen(filename, "w");
  if (NULL == (void *)f) printf("unable to open %s\n", filename);
  RNS(f, "unable to open file");

  fprintf(f, "MeshVersionFormatted 0\n\n");
  fprintf(f, "Dimension 2\n\n");

  ref_malloc_init(o2n, ref_node_max(ref_node), REF_INT, REF_EMPTY);
  ref_malloc_init(n2o, ref_node_max(ref_node), REF_INT, REF_EMPTY);

  nnode = 0;
  each_ref_node_valid_node(ref_node, node) {
    o2n[node] = nnode;
    n2o[nnode] = node;
    nnode++;
  }

  fprintf(f, "\nVertices\n%d\n", nnode);
  for (node = 0; node < nnode; node++) {
    fprintf(f, "%.16E %.16E %d\n", ref_node_xyz(ref_node, 0, n2o[node]),
            ref_node_xyz(ref_node, 2, n2o[node]), 1);
  }

  ref_cell = ref_grid_edg(ref_grid);
  fprintf(f, "\nEdges\n%d\n", ref_cell_n(ref_cell));
  nedge = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    nedge++;
    fprintf(f, "%d %d %d\n", o2n[nodes[0]] + 1, o2n[nodes[1]] + 1, nodes[2]);
  }
  REIS(nedge, ref_cell_n(ref_cell), "edge/quad miscount");

  ref_cell = ref_grid_tri(ref_grid);
  fprintf(f, "\nTriangles\n%d\n", ref_cell_n(ref_cell));
  ntri = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    ntri++;
    fprintf(f, "%d %d %d %d\n", o2n[nodes[0]] + 1, o2n[nodes[2]] + 1,
            o2n[nodes[1]] + 1, nodes[3]);
  }
  REIS(ntri, ref_cell_n(ref_cell), "triangle miscount");

  ref_free(n2o);
  ref_free(o2n);

  fclose(f);

  return REF_SUCCESS;
}